

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spaceusage.c
# Opt level: O1

sizes fuse8(size_t n)

{
  ulong *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  bool bVar11;
  byte bVar12;
  int iVar13;
  void *pvVar14;
  void *__ptr;
  void *__s;
  void *__ptr_00;
  void *__s_00;
  void *__ptr_01;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  size_t sVar25;
  uint uVar26;
  uint uVar27;
  byte bVar28;
  int iVar29;
  ulong uVar30;
  uint uVar31;
  uint32_t i;
  uint uVar32;
  byte bVar33;
  ulong uVar34;
  ulong uVar35;
  void *__ptr_02;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  sizes sVar42;
  int local_f8;
  ulong local_e8;
  uint local_b8 [4];
  uint local_a8;
  void *local_98;
  uint64_t *local_90;
  int local_88;
  uint local_84;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  size_t local_58;
  ulong local_50;
  undefined1 local_48 [16];
  
  uVar27 = (uint)n;
  uVar23 = n & 0xffffffff;
  if (uVar27 == 0) {
    uVar17 = 4;
  }
  else {
    dVar36 = log((double)uVar23);
    dVar36 = floor(dVar36 / 1.2029723039923526 + 2.25);
    uVar17 = (ulong)(uint)(1 << ((byte)(long)dVar36 & 0x1f));
  }
  uVar24 = 0x40000;
  if ((uint)uVar17 < 0x40000) {
    uVar24 = uVar17;
  }
  dVar36 = 0.0;
  if (1 < uVar27) {
    dVar36 = log((double)uVar23);
    dVar36 = 3.4538776394910684 / dVar36 + 0.875;
    if (dVar36 <= 1.125) {
      dVar36 = 1.125;
    }
  }
  iVar9 = (int)uVar24;
  uVar26 = iVar9 - 1;
  iVar13 = 0;
  if (1 < uVar27) {
    dVar36 = round(dVar36 * (double)uVar23);
    iVar13 = (int)(long)dVar36;
  }
  uVar31 = (uint)(((-iVar9 & (iVar13 + iVar9) - 1U) + uVar26) / uVar24);
  uVar32 = 1;
  if (2 < uVar31) {
    uVar32 = uVar31 - 2;
  }
  uVar23 = (ulong)((uVar32 + 2) * iVar9);
  pvVar14 = calloc(uVar23,1);
  if (pvVar14 == (void *)0x0) {
    puts("allocation failed");
    sVar18 = 0;
    sVar25 = 0;
    goto LAB_001025f2;
  }
  local_90 = (uint64_t *)malloc(n * 8);
  auVar39 = _DAT_00104060;
  if (n != 0) {
    lVar20 = n - 1;
    auVar37._8_4_ = (int)lVar20;
    auVar37._0_8_ = lVar20;
    auVar37._12_4_ = (int)((ulong)lVar20 >> 0x20);
    uVar17 = 0;
    auVar37 = auVar37 ^ _DAT_00104060;
    auVar40 = _DAT_00104050;
    do {
      auVar41 = auVar40 ^ auVar39;
      if ((bool)(~(auVar41._4_4_ == auVar37._4_4_ && auVar37._0_4_ < auVar41._0_4_ ||
                  auVar37._4_4_ < auVar41._4_4_) & 1)) {
        local_90[uVar17] = uVar17;
      }
      if ((auVar41._12_4_ != auVar37._12_4_ || auVar41._8_4_ <= auVar37._8_4_) &&
          auVar41._12_4_ <= auVar37._12_4_) {
        local_90[uVar17 + 1] = uVar17 + 1;
      }
      uVar17 = uVar17 + 2;
      lVar20 = auVar40._8_8_;
      auVar40._0_8_ = auVar40._0_8_ + 2;
      auVar40._8_8_ = lVar20 + 2;
    } while ((n + 1 & 0xfffffffffffffffe) != uVar17);
  }
  local_84 = uVar32 * iVar9;
  local_98 = pvVar14;
  pvVar14 = calloc((ulong)(uVar27 + 1),8);
  __ptr = malloc(uVar23 * 4);
  __s = calloc(uVar23,1);
  __ptr_00 = malloc(n & 0xffffffff);
  __s_00 = calloc(uVar23,8);
  iVar13 = -0x40;
  do {
    iVar22 = iVar13;
    uVar27 = 1 << ((char)iVar22 + 0x41U & 0x1f);
    iVar13 = iVar22 + 1;
  } while (uVar27 < uVar32);
  uVar17 = (ulong)uVar27;
  __ptr_01 = malloc(uVar17 * 4);
  auVar39._0_4_ = -(uint)((int)((ulong)__ptr >> 0x20) == 0 && (int)__ptr == 0);
  auVar39._4_4_ = -(uint)((int)__s == 0 && (int)((ulong)__s >> 0x20) == 0);
  auVar39._8_4_ = -(uint)((int)((ulong)__ptr_00 >> 0x20) == 0 && (int)__ptr_00 == 0);
  auVar39._12_4_ = -(uint)((int)__s_00 == 0 && (int)((ulong)__s_00 >> 0x20) == 0);
  iVar13 = movmskps((int)__ptr_01,auVar39);
  if (((iVar13 == 0) && (pvVar14 != (void *)0x0)) && (__ptr_01 != (void *)0x0)) {
    *(undefined8 *)((long)pvVar14 + (n & 0xffffffff) * 8) = 1;
    local_58 = uVar23 * 8;
    local_60 = uVar24 * 2;
    local_68 = (ulong)(uVar26 & 0x3ffff);
    lVar20 = uVar17 - 1;
    auVar41._8_4_ = (int)lVar20;
    auVar41._0_8_ = lVar20;
    auVar41._12_4_ = (int)((ulong)lVar20 >> 0x20);
    local_78 = 0x10a2a556c2d61962;
    uVar24 = 0x6df6b22537d23467;
    auVar41 = auVar41 ^ _DAT_00104060;
    iVar13 = 1;
    local_80 = (ulong)(uint)-(iVar22 + 1);
    local_88 = iVar22 + 0x41;
    local_48 = auVar41;
    local_50 = uVar17 * 4 + 4 & 0xfffffffffffffff8;
    auVar39 = _DAT_00104060;
LAB_00101fd0:
    iVar22 = (int)n;
    uVar31 = 0;
    uVar17 = 0;
    auVar38 = _DAT_00104050;
    do {
      auVar40 = auVar38 ^ auVar39;
      if ((bool)(~(auVar40._4_4_ == auVar41._4_4_ && auVar41._0_4_ < auVar40._0_4_ ||
                  auVar41._4_4_ < auVar40._4_4_) & 1)) {
        *(uint *)((long)__ptr_01 + uVar17) = uVar31 >> ((byte)local_88 & 0x1f);
      }
      if ((auVar40._12_4_ != auVar41._12_4_ || auVar40._8_4_ <= auVar41._8_4_) &&
          auVar40._12_4_ <= auVar41._12_4_) {
        *(uint *)((long)__ptr_01 + uVar17 + 4) = iVar22 + uVar31 >> ((byte)local_88 & 0x1f);
      }
      lVar20 = auVar38._8_8_;
      auVar38._0_8_ = auVar38._0_8_ + 2;
      auVar38._8_8_ = lVar20 + 2;
      uVar17 = uVar17 + 8;
      uVar31 = uVar31 + iVar22 * 2;
    } while (local_50 != uVar17);
    uVar17 = CONCAT44(0,local_84);
    local_70 = uVar24;
    if (iVar22 == 0) {
      bVar11 = true;
      iVar29 = 0;
    }
    else {
      uVar15 = 0;
      do {
        uVar19 = (local_90[uVar15] + uVar24 >> 0x21 ^ local_90[uVar15] + uVar24) * -0xae502812aa7333
        ;
        uVar19 = (uVar19 >> 0x21 ^ uVar19) * -0x3b314601e57a13ad;
        uVar19 = uVar19 >> 0x21 ^ uVar19;
        uVar30 = uVar19 >> ((byte)local_80 & 0x3f);
        while( true ) {
          uVar31 = *(uint *)((long)__ptr_01 + uVar30 * 4);
          if (*(long *)((long)pvVar14 + (ulong)uVar31 * 8) == 0) break;
          uVar30 = (ulong)((int)uVar30 + 1U & uVar27 - 1);
        }
        *(ulong *)((long)pvVar14 + (ulong)uVar31 * 8) = uVar19;
        *(uint *)((long)__ptr_01 + uVar30 * 4) = uVar31 + 1;
        uVar15 = uVar15 + 1;
      } while (uVar15 != (n & 0xffffffff));
      uVar15 = 0;
      bVar11 = false;
      iVar29 = 0;
      do {
        uVar19 = *(ulong *)((long)pvVar14 + uVar15 * 8);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar19;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar17;
        lVar20 = SUB168(auVar3 * auVar6,8);
        *(char *)((long)__s + lVar20) = *(char *)((long)__s + lVar20) + '\x04';
        puVar1 = (ulong *)((long)__s_00 + lVar20 * 8);
        *puVar1 = *puVar1 ^ uVar19;
        iVar10 = SUB164(auVar3 * auVar6,8);
        uVar16 = (ulong)((uint)(uVar19 >> 0x12) & (uint)local_68 ^ iVar10 + iVar9);
        bVar28 = *(byte *)((long)__s + uVar16);
        puVar1 = (ulong *)((long)__s_00 + uVar16 * 8);
        *puVar1 = *puVar1 ^ uVar19;
        *(byte *)((long)__s + uVar16) = (bVar28 ^ 1) + 4;
        uVar34 = (ulong)((uint)uVar19 & uVar26 ^ (int)local_60 + iVar10);
        bVar28 = *(char *)((long)__s + uVar34) + 4;
        *(byte *)((long)__s + uVar34) = bVar28;
        uVar30 = *(ulong *)((long)__s_00 + uVar34 * 8);
        uVar35 = uVar30 ^ uVar19;
        *(ulong *)((long)__s_00 + uVar34 * 8) = uVar35;
        *(byte *)((long)__s + uVar34) = bVar28 ^ 2;
        uVar21 = *(ulong *)((long)__s_00 + lVar20 * 8);
        uVar2 = *(ulong *)((long)__s_00 + uVar16 * 8);
        if (((uVar35 & uVar21 & uVar2) == 0) &&
           ((((uVar21 == 0 && (*(char *)((long)__s + lVar20) == '\b')) ||
             ((uVar2 == 0 && (*(char *)((long)__s + uVar16) == '\b')))) ||
            ((uVar30 == uVar19 && (bVar28 == 10)))))) {
          iVar29 = iVar29 + 1;
          *(char *)((long)__s + lVar20) = *(char *)((long)__s + lVar20) + -4;
          *(ulong *)((long)__s_00 + lVar20 * 8) = uVar21 ^ uVar19;
          bVar28 = *(byte *)((long)__s + uVar16);
          puVar1 = (ulong *)((long)__s_00 + uVar16 * 8);
          *puVar1 = *puVar1 ^ uVar19;
          *(byte *)((long)__s + uVar16) = (bVar28 ^ 1) - 4;
          *(byte *)((long)__s + uVar34) = (*(byte *)((long)__s + uVar34) ^ 2) - 4;
          puVar1 = (ulong *)((long)__s_00 + uVar34 * 8);
          *puVar1 = *puVar1 ^ uVar19;
        }
        if (*(byte *)((long)__s + lVar20) < 4) {
          bVar11 = true;
        }
        if (*(byte *)((long)__s + uVar16) < 4) {
          bVar11 = true;
        }
        if (*(byte *)((long)__s + uVar34) < 4) {
          bVar11 = true;
        }
        uVar15 = uVar15 + 1;
      } while ((n & 0xffffffff) != uVar15);
      bVar11 = !bVar11;
    }
    if (bVar11) {
      local_e8 = 0;
      uVar15 = 0;
      if (uVar23 != 0) {
        uVar19 = 0;
        uVar31 = 0;
        do {
          *(int *)((long)__ptr + (ulong)uVar31 * 4) = (int)uVar19;
          uVar31 = ((*(byte *)((long)__s + uVar19) & 0xfc) == 4) + uVar31;
          uVar15 = (ulong)uVar31;
          uVar19 = uVar19 + 1;
        } while (uVar23 != uVar19);
      }
      if ((int)uVar15 != 0) {
        uVar19 = 0;
        do {
          uVar31 = (int)uVar15 - 1;
          uVar15 = (ulong)uVar31;
          uVar30 = (ulong)*(uint *)((long)__ptr + uVar15 * 4);
          bVar28 = *(byte *)((long)__s + uVar30);
          local_e8 = uVar19;
          if ((bVar28 & 0xfc) == 4) {
            uVar30 = *(ulong *)((long)__s_00 + uVar30 * 8);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = uVar30;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar17;
            local_b8[3] = SUB164(auVar4 * auVar7,8);
            local_b8[1] = (uint)(uVar30 >> 0x12) & (uint)local_68 ^ local_b8[3] + iVar9;
            local_b8[2] = uVar26 & (uint)uVar30 ^ (int)local_60 + local_b8[3];
            local_a8 = local_b8[1];
            uVar32 = bVar28 & 3;
            local_e8 = (ulong)((int)uVar19 + 1);
            uVar21 = (ulong)local_b8[(ulong)uVar32 + 1];
            bVar28 = *(byte *)((long)__s + uVar21);
            bVar12 = (byte)uVar32;
            *(uint *)((long)__ptr + uVar15 * 4) = local_b8[(ulong)uVar32 + 1];
            uVar31 = uVar31 + ((bVar28 & 0xfc) == 8);
            bVar33 = bVar12 - 2;
            if (bVar12 < 2) {
              bVar33 = bVar12 + 1;
            }
            *(byte *)((long)__ptr_00 + uVar19) = bVar12;
            *(ulong *)((long)pvVar14 + uVar19 * 8) = uVar30;
            puVar1 = (ulong *)((long)__s_00 + uVar21 * 8);
            *puVar1 = *puVar1 ^ uVar30;
            *(byte *)((long)__s + uVar21) = bVar33 ^ bVar28 - 4;
            uVar15 = (ulong)local_b8[uVar32 + 2];
            bVar28 = *(byte *)((long)__s + uVar15);
            *(uint *)((long)__ptr + (ulong)uVar31 * 4) = local_b8[uVar32 + 2];
            bVar12 = (char)(uVar32 + 2) - 3;
            if ((ulong)uVar32 == 0) {
              bVar12 = 2;
            }
            *(byte *)((long)__s + uVar15) = bVar12 ^ bVar28 - 4;
            puVar1 = (ulong *)((long)__s_00 + uVar15 * 8);
            *puVar1 = *puVar1 ^ uVar30;
            uVar15 = (ulong)(((bVar28 & 0xfc) == 8) + uVar31);
          }
          uVar19 = local_e8;
        } while ((int)uVar15 != 0);
      }
      if ((int)local_e8 + iVar29 != iVar22) {
        local_f8 = 0;
        if (iVar29 != 0) {
          n = binary_fuse_sort_and_remove_dup(local_90,n & 0xffffffff);
        }
        goto LAB_00102442;
      }
      local_f8 = 4;
      bVar11 = true;
    }
    else {
      local_f8 = 6;
LAB_00102442:
      bVar11 = false;
      memset(pvVar14,0,(n & 0xffffffff) << 3);
      memset(__s,0,uVar23);
      memset(__s_00,0,local_58);
      local_78 = local_78 + 0x9e3779b97f4a7c15;
      uVar24 = (local_78 >> 0x1e ^ local_78) * -0x40a7b892e31b1a47;
      uVar24 = (uVar24 >> 0x1b ^ uVar24) * -0x6b2fb644ecceee15;
      uVar24 = uVar24 >> 0x1f ^ uVar24;
      auVar41 = local_48;
      auVar39 = _DAT_00104060;
      local_e8 = n;
    }
    __ptr_02 = local_98;
    if ((local_f8 == 6) || (local_f8 == 0)) goto LAB_00102527;
    if (bVar11) {
      uVar27 = (uint)local_e8;
      if (uVar27 != 0) {
        uVar31 = uVar27 - 1;
        do {
          uVar24 = *(ulong *)((long)pvVar14 + (ulong)uVar31 * 8);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar24;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar17;
          local_b8[0] = SUB164(auVar5 * auVar8,8);
          local_b8[1] = (uint)(uVar24 >> 0x12) & uVar26 & 0x3ffff ^ local_b8[0] + iVar9;
          local_b8[2] = (uint)uVar24 & uVar26 ^ iVar9 * 2 + local_b8[0];
          local_b8[3] = local_b8[0];
          uVar15 = (ulong)*(byte *)((long)__ptr_00 + (ulong)uVar31);
          local_a8 = local_b8[1];
          *(byte *)((long)local_98 + (ulong)local_b8[uVar15]) =
               (byte)(uVar24 >> 0x20) ^ (byte)uVar24 ^
               *(byte *)((long)local_98 + (ulong)local_b8[uVar15 + 1]) ^
               *(byte *)((long)local_98 + (ulong)local_b8[uVar15 + 2]);
          uVar31 = uVar31 - 1;
        } while (uVar31 < uVar27);
      }
      free(__ptr);
      free(__s);
      free(__ptr_00);
      free(__s_00);
      free(pvVar14);
      free(__ptr_01);
      goto LAB_00102598;
    }
    goto LAB_00102584;
  }
LAB_00102553:
  free(__ptr);
  free(__s);
  free(__ptr_00);
  free(__s_00);
  free(pvVar14);
  free(__ptr_01);
LAB_00102584:
  puts("populating failed");
  __ptr_02 = local_98;
LAB_00102598:
  free(local_90);
  sVar25 = (uVar23 + 7 >> 3) + 0xc;
  if (uVar23 != 0) {
    uVar17 = 0;
    do {
      sVar25 = (sVar25 + 1) - (ulong)(*(char *)((long)__ptr_02 + uVar17) == '\0');
      uVar17 = uVar17 + 1;
    } while (uVar23 != uVar17);
  }
  sVar18 = uVar23 + 0x1c;
  free(__ptr_02);
LAB_001025f2:
  sVar42.pack = sVar25;
  sVar42.standard = sVar18;
  return sVar42;
LAB_00102527:
  iVar13 = iVar13 + 1;
  n = local_e8;
  if (iVar13 == 0x65) goto code_r0x0010253c;
  goto LAB_00101fd0;
code_r0x0010253c:
  memset(local_98,0xff,uVar23);
  goto LAB_00102553;
}

Assistant:

sizes fuse8(size_t n) {
  binary_fuse8_t filter = {0};
  if (! binary_fuse8_allocate(n, &filter)) {
    printf("allocation failed\n");
    return (sizes) {0, 0};
  }
  uint64_t* big_set = malloc(n * sizeof(uint64_t));
  for(size_t i = 0; i < n; i++) {
    big_set[i] = i;
  }
  bool is_ok = binary_fuse8_populate(big_set, n, &filter);
  if(! is_ok ) {
    printf("populating failed\n");
  }
  free(big_set);
  sizes s = {
    .standard = binary_fuse8_serialization_bytes(&filter),
    .pack = binary_fuse8_pack_bytes(&filter)
  };
  binary_fuse8_free(&filter);
  return s;
}